

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O1

char * luaO_pushvfstring(lua_State *L,char *fmt,__va_list_tag *argp)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  GCObject *pGVar5;
  long *plVar6;
  char *pcVar7;
  undefined8 *puVar8;
  StkId pTVar9;
  size_t sVar10;
  int *piVar11;
  lua_Number *plVar12;
  int iVar13;
  lua_Number lVar14;
  char buff;
  char local_58 [40];
  
  iVar13 = 0;
  do {
    pcVar4 = strchr(fmt,0x25);
    if (pcVar4 != (char *)0x0) {
      if ((long)L->stack_last - (long)L->top < 0x21) {
        luaD_growstack(L,2);
      }
      pTVar9 = L->top;
      L->top = pTVar9 + 1;
      pGVar5 = (GCObject *)luaS_newlstr(L,fmt,(long)pcVar4 - (long)fmt);
      (pTVar9->value_).gc = pGVar5;
      pTVar9->tt_ = (pGVar5->gch).tt | 0x40;
      bVar1 = pcVar4[1];
      if (bVar1 < 0x66) {
        if (bVar1 == 0x25) {
          pTVar9 = L->top;
          L->top = pTVar9 + 1;
          sVar10 = 1;
          pcVar7 = "%";
        }
        else {
          if (bVar1 != 99) {
            if (bVar1 != 100) {
LAB_0010c88a:
              luaG_runerror(L,"invalid option \'%%%c\' to \'lua_pushfstring\'",
                            (ulong)(uint)(int)(char)bVar1);
            }
            pTVar9 = L->top;
            L->top = pTVar9 + 1;
            uVar2 = argp->gp_offset;
            if ((ulong)uVar2 < 0x29) {
              piVar11 = (int *)((ulong)uVar2 + (long)argp->reg_save_area);
              argp->gp_offset = uVar2 + 8;
            }
            else {
              piVar11 = (int *)argp->overflow_arg_area;
              argp->overflow_arg_area = piVar11 + 2;
            }
            lVar14 = (lua_Number)*piVar11;
            goto LAB_0010c7f9;
          }
          uVar2 = argp->gp_offset;
          if ((ulong)uVar2 < 0x29) {
            pcVar7 = (char *)((ulong)uVar2 + (long)argp->reg_save_area);
            argp->gp_offset = uVar2 + 8;
          }
          else {
            pcVar7 = (char *)argp->overflow_arg_area;
            argp->overflow_arg_area = pcVar7 + 8;
          }
          local_58[0] = *pcVar7;
          pTVar9 = L->top;
          L->top = pTVar9 + 1;
          sVar10 = 1;
          pcVar7 = local_58;
        }
LAB_0010c7d2:
        pGVar5 = (GCObject *)luaS_newlstr(L,pcVar7,sVar10);
        (pTVar9->value_).gc = pGVar5;
        pTVar9->tt_ = (pGVar5->gch).tt | 0x40;
      }
      else {
        if (bVar1 != 0x66) {
          if (bVar1 == 0x70) {
            uVar2 = argp->gp_offset;
            if ((ulong)uVar2 < 0x29) {
              puVar8 = (undefined8 *)((ulong)uVar2 + (long)argp->reg_save_area);
              argp->gp_offset = uVar2 + 8;
            }
            else {
              puVar8 = (undefined8 *)argp->overflow_arg_area;
              argp->overflow_arg_area = puVar8 + 1;
            }
            iVar3 = sprintf(local_58,"%p",*puVar8);
            sVar10 = (size_t)iVar3;
            pTVar9 = L->top;
            L->top = pTVar9 + 1;
            pcVar7 = local_58;
          }
          else {
            if (bVar1 != 0x73) goto LAB_0010c88a;
            uVar2 = argp->gp_offset;
            if ((ulong)uVar2 < 0x29) {
              plVar6 = (long *)((ulong)uVar2 + (long)argp->reg_save_area);
              argp->gp_offset = uVar2 + 8;
            }
            else {
              plVar6 = (long *)argp->overflow_arg_area;
              argp->overflow_arg_area = plVar6 + 1;
            }
            pcVar7 = (char *)*plVar6;
            if (pcVar7 == (char *)0x0) {
              pcVar7 = "(null)";
            }
            sVar10 = strlen(pcVar7);
            pTVar9 = L->top;
            L->top = pTVar9 + 1;
          }
          goto LAB_0010c7d2;
        }
        pTVar9 = L->top;
        L->top = pTVar9 + 1;
        uVar2 = argp->fp_offset;
        if ((ulong)uVar2 < 0xa1) {
          plVar12 = (lua_Number *)((ulong)uVar2 + (long)argp->reg_save_area);
          argp->fp_offset = uVar2 + 0x10;
        }
        else {
          plVar12 = (lua_Number *)argp->overflow_arg_area;
          argp->overflow_arg_area = plVar12 + 1;
        }
        lVar14 = *plVar12;
LAB_0010c7f9:
        (pTVar9->value_).n = lVar14;
        pTVar9->tt_ = 3;
      }
      iVar13 = iVar13 + 2;
      fmt = pcVar4 + 2;
    }
    if (pcVar4 == (char *)0x0) {
      if ((long)L->stack_last - (long)L->top < 0x11) {
        luaD_growstack(L,1);
      }
      sVar10 = strlen(fmt);
      pTVar9 = L->top;
      L->top = pTVar9 + 1;
      pGVar5 = (GCObject *)luaS_newlstr(L,fmt,sVar10);
      (pTVar9->value_).gc = pGVar5;
      pTVar9->tt_ = (pGVar5->gch).tt | 0x40;
      if (0 < iVar13) {
        luaV_concat(L,iVar13 + 1);
      }
      return (char *)(L->top[-1].value_.f + 0x18);
    }
  } while( true );
}

Assistant:

const char *luaO_pushvfstring (lua_State *L, const char *fmt, va_list argp) {
  int n = 0;
  for (;;) {
    const char *e = strchr(fmt, '%');
    if (e == NULL) break;
    luaD_checkstack(L, 2);  /* fmt + item */
    pushstr(L, fmt, e - fmt);
    switch (*(e+1)) {
      case 's': {
        const char *s = va_arg(argp, char *);
        if (s == NULL) s = "(null)";
        pushstr(L, s, strlen(s));
        break;
      }
      case 'c': {
        char buff;
        buff = cast(char, va_arg(argp, int));
        pushstr(L, &buff, 1);
        break;
      }
      case 'd': {
        setnvalue(L->top++, cast_num(va_arg(argp, int)));
        break;
      }
      case 'f': {
        setnvalue(L->top++, cast_num(va_arg(argp, l_uacNumber)));
        break;
      }
      case 'p': {
        char buff[4*sizeof(void *) + 8]; /* should be enough space for a `%p' */
        int l = sprintf(buff, "%p", va_arg(argp, void *));
        pushstr(L, buff, l);
        break;
      }
      case '%': {
        pushstr(L, "%", 1);
        break;
      }
      default: {
        luaG_runerror(L,
            "invalid option " LUA_QL("%%%c") " to " LUA_QL("lua_pushfstring"),
            *(e + 1));
      }
    }
    n += 2;
    fmt = e+2;
  }
  luaD_checkstack(L, 1);
  pushstr(L, fmt, strlen(fmt));
  if (n > 0) luaV_concat(L, n + 1);
  return svalue(L->top - 1);
}